

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O0

void __thiscall AsyncLogging::threadFunc(AsyncLogging *this)

{
  const_iterator __last;
  bool bVar1;
  bool bVar2;
  int iVar3;
  FixedBuffer<4000000> *pFVar4;
  element_type *peVar5;
  size_type sVar6;
  size_type sVar7;
  size_t __n;
  size_t __n_00;
  long in_RDI;
  size_t i;
  MutexLockGuard lock;
  BufferVector buffersToWrite;
  BufferPtr newBuffer2;
  BufferPtr newBuffer1;
  LogFile output;
  FixedBuffer<4000000> *in_stack_fffffffffffffeb8;
  LogFile *in_stack_fffffffffffffec0;
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  *in_stack_fffffffffffffec8;
  CountDownLatch *in_stack_fffffffffffffed0;
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  const_iterator in_stack_fffffffffffffee8;
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  size_type local_c8;
  undefined1 local_88 [24];
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  local_70;
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  local_50 [3];
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  if ((*(byte *)(in_RDI + 4) & 1) == 0) {
    __assert_fail("running_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                  ,0x30,"void AsyncLogging::threadFunc()");
  }
  CountDownLatch::countDown(in_stack_fffffffffffffed0);
  LogFile::LogFile((LogFile *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),iVar3);
  pFVar4 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  FixedBuffer<4000000>::FixedBuffer(pFVar4);
  std::shared_ptr<FixedBuffer<4000000>>::shared_ptr<FixedBuffer<4000000>,void>
            ((shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  pFVar4 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  FixedBuffer<4000000>::FixedBuffer(pFVar4);
  std::shared_ptr<FixedBuffer<4000000>>::shared_ptr<FixedBuffer<4000000>,void>
            ((shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  peVar5 = std::__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1094fe);
  FixedBuffer<4000000>::bzero(peVar5,pFVar4,__n);
  peVar5 = std::__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x109515);
  FixedBuffer<4000000>::bzero(peVar5,pFVar4,__n_00);
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::vector((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            *)0x109531);
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::reserve(in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8._M_current);
  while( true ) {
    if ((*(byte *)(in_RDI + 4) & 1) == 0) {
      LogFile::flush((LogFile *)in_stack_fffffffffffffed0);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::~vector((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 *)in_stack_fffffffffffffed0);
      std::shared_ptr<FixedBuffer<4000000>_>::~shared_ptr
                ((shared_ptr<FixedBuffer<4000000>_> *)0x109b66);
      std::shared_ptr<FixedBuffer<4000000>_>::~shared_ptr
                ((shared_ptr<FixedBuffer<4000000>_> *)0x109b73);
      LogFile::~LogFile(in_stack_fffffffffffffec0);
      return;
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
    bVar2 = false;
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10957c);
      iVar3 = FixedBuffer<4000000>::length(peVar5);
      bVar2 = iVar3 == 0;
    }
    if (!bVar2) {
      __assert_fail("newBuffer1 && newBuffer1->length()==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                    ,0x3a,"void AsyncLogging::threadFunc()");
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_70);
    bVar2 = false;
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1096a3);
      iVar3 = FixedBuffer<4000000>::length(peVar5);
      bVar2 = iVar3 == 0;
    }
    if (!bVar2) {
      __assert_fail("newBuffer2 && newBuffer2->length()==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                    ,0x3b,"void AsyncLogging::threadFunc()");
    }
    bVar2 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::empty((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                     *)in_stack_fffffffffffffed0);
    if (!bVar2) {
      __assert_fail("buffersToWrite.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                    ,0x3c,"void AsyncLogging::threadFunc()");
    }
    MutexLockGuard::MutexLockGuard
              ((MutexLockGuard *)in_stack_fffffffffffffec0,(MutexLock *)in_stack_fffffffffffffeb8);
    bVar2 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::empty((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                     *)in_stack_fffffffffffffed0);
    if (bVar2) {
      Condition::waitForSeconds
                ((Condition *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    }
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::push_back((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 *)in_stack_fffffffffffffed0,(value_type *)in_stack_fffffffffffffec8);
    std::__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffed0);
    std::shared_ptr<FixedBuffer<4000000>_>::operator=
              ((shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffec0,
               (shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffeb8);
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::swap((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x160));
    if (!bVar2) {
      std::shared_ptr<FixedBuffer<4000000>_>::operator=
                ((shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffec0,
                 (shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffeb8);
    }
    MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x10982b);
    bVar2 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::empty((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                     *)in_stack_fffffffffffffed0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    sVar6 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::size((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    *)local_88);
    if (0x19 < sVar6) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::begin((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               *)in_stack_fffffffffffffeb8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
      ::operator+((__normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
                   *)in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FixedBuffer<4000000>>const*,std::vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>>
      ::__normal_iterator<std::shared_ptr<FixedBuffer<4000000>>*>
                ((__normal_iterator<const_std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
                  *)in_stack_fffffffffffffec0,
                 (__normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
                  *)in_stack_fffffffffffffeb8);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::end((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             *)in_stack_fffffffffffffeb8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FixedBuffer<4000000>>const*,std::vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>>
      ::__normal_iterator<std::shared_ptr<FixedBuffer<4000000>>*>
                ((__normal_iterator<const_std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
                  *)in_stack_fffffffffffffec0,
                 (__normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
                  *)in_stack_fffffffffffffeb8);
      __last._M_current._4_4_ = in_stack_fffffffffffffee4;
      __last._M_current._0_4_ = in_stack_fffffffffffffee0;
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::erase(in_stack_fffffffffffffed8,in_stack_fffffffffffffee8,__last);
    }
    local_c8 = 0;
    while (sVar6 = local_c8,
          sVar7 = std::
                  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  ::size((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                          *)local_88), sVar6 < sVar7) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::operator[]((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    *)local_88,local_c8);
      peVar5 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10996a);
      in_stack_fffffffffffffee8._M_current =
           (shared_ptr<FixedBuffer<4000000>_> *)FixedBuffer<4000000>::data(peVar5);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::operator[]((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    *)local_88,local_c8);
      peVar5 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x109996);
      in_stack_fffffffffffffee4 = FixedBuffer<4000000>::length(peVar5);
      LogFile::append((LogFile *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      (char *)in_stack_fffffffffffffed8,
                      (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      local_c8 = local_c8 + 1;
    }
    sVar6 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::size((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    *)local_88);
    if (2 < sVar6) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::resize((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (size_type)in_stack_fffffffffffffed8);
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
    if (!bVar2) {
      bVar2 = std::
              vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
              ::empty((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                       *)in_stack_fffffffffffffed0);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!buffersToWrite.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                      ,0x5c,"void AsyncLogging::threadFunc()");
      }
      in_stack_fffffffffffffed0 = (CountDownLatch *)local_88;
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::back((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
              *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffed8 = local_50;
      std::shared_ptr<FixedBuffer<4000000>_>::operator=
                ((shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffec0,
                 (shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffeb8);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::pop_back((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  *)0x109a78);
      peVar5 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x109a82);
      FixedBuffer<4000000>::reset(peVar5);
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_70);
    if (!bVar2) {
      bVar2 = std::
              vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
              ::empty((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                       *)in_stack_fffffffffffffed0);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!buffersToWrite.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                      ,99,"void AsyncLogging::threadFunc()");
      }
      in_stack_fffffffffffffec0 = (LogFile *)local_88;
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::back((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
              *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec8 = &local_70;
      std::shared_ptr<FixedBuffer<4000000>_>::operator=
                ((shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffec0,
                 (shared_ptr<FixedBuffer<4000000>_> *)in_stack_fffffffffffffeb8);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::pop_back((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  *)0x109b06);
      peVar5 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x109b10);
      FixedBuffer<4000000>::reset(peVar5);
    }
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::clear((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             *)0x109b29);
    LogFile::flush((LogFile *)in_stack_fffffffffffffed0);
  }
  __assert_fail("!buffersToWrite.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                ,0x4d,"void AsyncLogging::threadFunc()");
}

Assistant:

void AsyncLogging::threadFunc(){
    assert(running_);
    latch_.countDown();
    LogFile output(basename_);
    BufferPtr newBuffer1(new Buffer);
    BufferPtr newBuffer2(new Buffer);
    newBuffer1->bzero();
    newBuffer2->bzero();
    BufferVector buffersToWrite;
    buffersToWrite.reserve(16);
    while (running_) {
        assert(newBuffer1 && newBuffer1->length()==0);
        assert(newBuffer2 && newBuffer2->length()==0);
        assert(buffersToWrite.empty());
        {
            MutexLockGuard lock(mutex_);
            if (buffers_.empty())
            {
                cond_.waitForSeconds(flushInterval_);
            }
            buffers_.push_back(currentBuffer_);
            currentBuffer_.reset();

            currentBuffer_ = std::move(newBuffer1);
            buffersToWrite.swap(buffers_);
            if(!nextBuffer_){
                nextBuffer_ = std::move(newBuffer2);
            }
        }

        assert(!buffersToWrite.empty());

        if(buffersToWrite.size() >25){
            buffersToWrite.erase(buffersToWrite.begin()+2, buffersToWrite.end());
        }

        for (size_t i=0; i<buffersToWrite.size(); ++i) {
            output.append(buffersToWrite[i]->data(), buffersToWrite[i]->length());
        }

        if(buffersToWrite.size() > 2){
            buffersToWrite.resize(2);
        }

        if(!newBuffer1){
            assert(!buffersToWrite.empty());
            newBuffer1 = buffersToWrite.back();
            buffersToWrite.pop_back();
            newBuffer1->reset();
        }

        if(!newBuffer2){
            assert(!buffersToWrite.empty());
            newBuffer2 = buffersToWrite.back();
            buffersToWrite.pop_back();
            newBuffer2->reset();
        }

        buffersToWrite.clear();
        output.flush();
    }
    output.flush();
}